

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,char32_t *value)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  Debug *pDVar3;
  char32_t *pcVar4;
  char32_t *local_48;
  size_t sStack_40;
  char32_t local_38 [4];
  ArrayView<const_char32_t> local_28;
  
  if (value == (char32_t *)0x0) {
    pcVar4 = (char32_t *)0x4;
  }
  else {
    pcVar2 = value + -1;
    do {
      pcVar4 = pcVar2 + 1;
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar4;
    } while (*pcVar1 != L'\0');
  }
  local_48 = local_38;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_48,value,pcVar4);
  local_28._data = local_48;
  local_28._size = sStack_40;
  pDVar3 = operator<<<Corrade::Containers::ArrayView<const_char32_t>,_0>(this,&local_28);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return pDVar3;
}

Assistant:

Debug& Debug::operator<<(const char32_t* value) {
    return *this << std::u32string(value);
}